

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::detail::logTestStart(char *name,char *file,uint line)

{
  pointer pSVar1;
  ContextState *pCVar2;
  char *pcVar3;
  Color *pCVar4;
  uint uVar5;
  Color col_3;
  String subcaseStuff;
  String local_c70;
  String local_c68;
  String local_c60;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  Color col;
  undefined7 uStack_c37;
  char msg [1024];
  char loc [1024];
  
  pcVar3 = fileForOutput(file);
  snprintf(loc,0x400,"%s(%d)\n",pcVar3,(ulong)line);
  pCVar4 = (Color *)msg;
  snprintf((char *)pCVar4,0x400,"%s\n",name);
  Color::use(pCVar4,Yellow);
  puts("===============================================================================");
  pCVar4 = &col;
  Color::~Color(pCVar4);
  if (loc[0] != '\0') {
    Color::use(pCVar4,LightGrey);
    printf("%s");
    pCVar4 = &col;
    Color::~Color(pCVar4);
  }
  if (msg[0] != '\0') {
    Color::use(pCVar4,None);
    printf("%s",msg);
    Color::~Color(&col);
  }
  pCVar4 = (Color *)&subcaseStuff;
  String::String(&subcaseStuff,"");
  pCVar2 = getContextState::data;
  uVar5 = 0;
  while( true ) {
    pSVar1 = (pCVar2->subcasesStack).
             super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pCVar2->subcasesStack).
                      super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5) <=
        (ulong)uVar5) break;
    pCVar4 = &col;
    snprintf((char *)&col,0x400,"  %s\n",pSVar1[uVar5].m_signature.m_name);
    if (col != (Color)0x0) {
      Color::use(pCVar4,None);
      printf("%s",&col);
      Color::~Color(&col_3);
    }
    String::String((String *)&col_3,(char *)&col);
    String::operator+=(&subcaseStuff,(String *)&col_3);
    pCVar4 = _col_3;
    free(_col_3);
    uVar5 = uVar5 + 1;
  }
  Color::use(pCVar4,None);
  putchar(10);
  Color::~Color(&col);
  String::String(&local_c68,
                 "===============================================================================\n"
                );
  String::String(&local_c70,loc);
  String::operator+(&local_c60,&local_c68);
  String::String(&local_c48,msg);
  String::operator+(&local_c40,&local_c60);
  String::String(&local_c50,subcaseStuff.m_str);
  String::operator+((String *)&col_3,&local_c40);
  String::String(&local_c58,"\n");
  String::operator+((String *)&col,(String *)&col_3);
  free((void *)CONCAT71(uStack_c37,col));
  free(local_c58.m_str);
  free(_col_3);
  free(local_c50.m_str);
  free(local_c40.m_str);
  free(local_c48.m_str);
  free(local_c60.m_str);
  free(local_c70.m_str);
  free(local_c68.m_str);
  free(subcaseStuff.m_str);
  return;
}

Assistant:

void logTestStart(const char* name, const char* file, unsigned line) {
        const char* newLine = "\n";

        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)\n", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "%s\n", name);

        DOCTEST_PRINTF_COLORED(getSeparator(), Color::Yellow);
        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, Color::None);

        String                subcaseStuff  = "";
        std::vector<Subcase>& subcasesStack = getContextState()->subcasesStack;
        for(unsigned i = 0; i < subcasesStack.size(); ++i) {
            char subcase[DOCTEST_SNPRINTF_BUFFER_LENGTH];
            DOCTEST_SNPRINTF(subcase, DOCTEST_COUNTOF(loc), "  %s\n",
                             subcasesStack[i].m_signature.m_name);
            DOCTEST_PRINTF_COLORED(subcase, Color::None);
            subcaseStuff += subcase;
        }

        DOCTEST_PRINTF_COLORED(newLine, Color::None);

        printToDebugConsole(String(getSeparator()) + loc + msg + subcaseStuff.c_str() + newLine);
    }